

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polylinecurve.cpp
# Opt level: O0

int __thiscall
ON_PolylineCurve::IsPolyline
          (ON_PolylineCurve *this,ON_SimpleArray<ON_3dPoint> *pline_points,
          ON_SimpleArray<double> *pline_t)

{
  int local_24;
  int rc;
  ON_SimpleArray<double> *pline_t_local;
  ON_SimpleArray<ON_3dPoint> *pline_points_local;
  ON_PolylineCurve *this_local;
  
  if (pline_points != (ON_SimpleArray<ON_3dPoint> *)0x0) {
    ON_SimpleArray<ON_3dPoint>::SetCount(pline_points,0);
  }
  if (pline_t != (ON_SimpleArray<double> *)0x0) {
    ON_SimpleArray<double>::SetCount(pline_t,0);
  }
  local_24 = PointCount(this);
  if (local_24 < 2) {
    local_24 = 0;
  }
  else {
    if (pline_points != (ON_SimpleArray<ON_3dPoint> *)0x0) {
      ON_SimpleArray<ON_3dPoint>::operator=
                (pline_points,(ON_SimpleArray<ON_3dPoint> *)&this->m_pline);
    }
    if (pline_t != (ON_SimpleArray<double> *)0x0) {
      ON_SimpleArray<double>::operator=(pline_t,&this->m_t);
    }
  }
  return local_24;
}

Assistant:

int ON_PolylineCurve::IsPolyline(
      ON_SimpleArray<ON_3dPoint>* pline_points,
      ON_SimpleArray<double>* pline_t
      ) const
{
  if ( pline_points )
    pline_points->SetCount(0);
  if ( pline_t )
    pline_t->SetCount(0);
  int rc = this->PointCount();
  if ( rc >= 2 )
  {
    if ( pline_points )
      pline_points->operator=(m_pline);
    if ( pline_t )
      pline_t->operator=(m_t);
  }
  else
    rc = 0;
  return rc;
}